

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::AppendSuccessInformation(cmFindPackageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  cmState *pcVar5;
  char *value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string transitivePropName;
  string versionInfo;
  string versionInfoPropName;
  string quietInfoPropName;
  string upperFound;
  string found;
  string local_150;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  char *local_38;
  
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->Name)._M_dataplus._M_p;
  local_50 = (this->Name)._M_string_length;
  local_60._M_len = 7;
  local_60._M_str = "_CMAKE_";
  local_40 = 0x16;
  local_38 = "_TRANSITIVE_DEPENDENCY";
  views._M_len = 3;
  views._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_150,views);
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  cmState::SetGlobalProperty(pcVar5,&local_150,"False");
  paVar1 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  local_60._M_str = (this->Name)._M_dataplus._M_p;
  local_60._M_len = (this->Name)._M_string_length;
  local_50 = 6;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x790c32;
  views_00._M_len = 2;
  views_00._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_a0,views_00);
  cmsys::SystemTools::UpperCase(&local_c0,&local_a0);
  bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&local_c0);
  bVar4 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&local_a0);
  AppendToFoundProperty(this,bVar3 || bVar4);
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->Name)._M_dataplus._M_p;
  local_50 = (this->Name)._M_string_length;
  local_60._M_len = 7;
  local_60._M_str = "_CMAKE_";
  local_40 = 6;
  local_38 = "_QUIET";
  views_01._M_len = 3;
  views_01._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_e0,views_01);
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  value = "FALSE";
  if (this->Quiet != false) {
    value = "TRUE";
  }
  cmState::SetGlobalProperty(pcVar5,&local_e0,value);
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->Name)._M_dataplus._M_p;
  local_50 = (this->Name)._M_string_length;
  local_60._M_len = 7;
  local_60._M_str = "_CMAKE_";
  local_40 = 0x11;
  local_38 = "_REQUIRED_VERSION";
  views_02._M_len = 3;
  views_02._M_array = &local_60;
  cmCatViews_abi_cxx11_(&local_100,views_02);
  local_118 = 0;
  local_110 = '\0';
  local_120 = &local_110;
  if ((this->VersionRange)._M_string_length == 0) {
    sVar2 = (this->Version)._M_string_length;
    if (sVar2 != 0) {
      local_60._M_str = ">=";
      if (this->VersionExact != false) {
        local_60._M_str = "==";
      }
      local_150._M_dataplus._M_p = (pointer)0x1;
      local_150.field_2._M_local_buf[0] = ' ';
      local_60._M_len = 2;
      local_50 = 1;
      local_38 = (this->Version)._M_dataplus._M_p;
      views_04._M_len = 3;
      views_04._M_array = &local_60;
      local_150._M_string_length = (size_type)paVar1;
      local_48 = paVar1;
      local_40 = sVar2;
      cmCatViews_abi_cxx11_(&local_80,views_04);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_120);
  }
  pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
  cmState::SetGlobalProperty(pcVar5,&local_100,local_120);
  if (this->Required == true) {
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(this->Name)._M_dataplus._M_p;
    local_50 = (this->Name)._M_string_length;
    local_60._M_len = 7;
    local_60._M_str = "_CMAKE_";
    local_40 = 5;
    local_38 = "_TYPE";
    views_03._M_len = 3;
    views_03._M_array = &local_60;
    cmCatViews_abi_cxx11_(&local_150,views_03);
    pcVar5 = cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    cmState::SetGlobalProperty(pcVar5,&local_150,"REQUIRED");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::AppendSuccessInformation()
{
  {
    std::string const transitivePropName =
      cmStrCat("_CMAKE_", this->Name, "_TRANSITIVE_DEPENDENCY");
    this->Makefile->GetState()->SetGlobalProperty(transitivePropName, "False");
  }
  std::string const found = cmStrCat(this->Name, "_FOUND");
  std::string const upperFound = cmSystemTools::UpperCase(found);

  bool const upperResult = this->Makefile->IsOn(upperFound);
  bool const result = this->Makefile->IsOn(found);
  bool const packageFound = (result || upperResult);

  this->AppendToFoundProperty(packageFound);

  // Record whether the find was quiet or not, so this can be used
  // e.g. in FeatureSummary.cmake
  std::string const quietInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_QUIET");
  this->Makefile->GetState()->SetGlobalProperty(
    quietInfoPropName, this->Quiet ? "TRUE" : "FALSE");

  // set a global property to record the required version of this package
  std::string const versionInfoPropName =
    cmStrCat("_CMAKE_", this->Name, "_REQUIRED_VERSION");
  std::string versionInfo;
  if (!this->VersionRange.empty()) {
    versionInfo = this->VersionRange;
  } else if (!this->Version.empty()) {
    versionInfo =
      cmStrCat(this->VersionExact ? "==" : ">=", ' ', this->Version);
  }
  this->Makefile->GetState()->SetGlobalProperty(versionInfoPropName,
                                                versionInfo.c_str());
  if (this->Required) {
    std::string const requiredInfoPropName =
      cmStrCat("_CMAKE_", this->Name, "_TYPE");
    this->Makefile->GetState()->SetGlobalProperty(requiredInfoPropName,
                                                  "REQUIRED");
  }
}